

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SetArrayItemI_CI4<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint index;
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  JavascriptArray *this_00;
  undefined4 *puVar4;
  SparseArraySegmentBase *pSVar5;
  uint32 offset;
  
  pvVar1 = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,pvVar1,false,true);
  this_00 = JavascriptArray::FromAnyArray(pvVar1);
  if ((((((this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr !=
      *(ScriptContext **)(this + 0x78)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15da,"(array->GetScriptContext() == GetScriptContext())",
                                "array->GetScriptContext() == GetScriptContext()");
    if (!bVar3) goto LAB_00a64461;
    *puVar4 = 0;
  }
  index = playout->Element;
  pvVar1 = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,pvVar1,false,true);
  if ((this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x15df,
                                "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(array))",
                                "VirtualTableInfo<JavascriptArray>::HasVirtualTable(array)");
    if (!bVar3) {
LAB_00a64461:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = JavascriptArray::GetLastUsedSegment(this_00);
  offset = index - pSVar5->left;
  if ((pSVar5->left <= index) && (offset < pSVar5->size)) {
    JavascriptArray::DirectSetItemInLastUsedSegmentAt<void*>(this_00,offset,pvVar1);
    return;
  }
  JavascriptOperators::SetItem
            (this_00,(RecyclableObject *)this_00,index,pvVar1,
             (((((this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
             PropertyOperation_None,0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArrayItemI_CI4(const unaligned T* playout)
    {
        // Note that this code assumes that we only get here when we see an array literal,
        // so we know that the instance is truly an array, and the index is a uint32.
        // If/when we use this for cases like "a[0] = x", we'll at least have to check
        // whether "a" is really an array.

        JavascriptArray* array = JavascriptArray::FromAnyArray(GetReg(playout->Instance));

        // The array is create by the built-in on the same script context
        Assert(array->GetScriptContext() == GetScriptContext());

        uint32 index = playout->Element;
        Var value = GetReg(playout->Value);

        Assert(VirtualTableInfo<JavascriptArray>::HasVirtualTable(array));
        SparseArraySegment<Var>* lastUsedSeg = (SparseArraySegment<Var>*)array->GetLastUsedSegment();
        if (index >= lastUsedSeg->left)
        {
            uint32 index2 = index - lastUsedSeg->left;
            if (index2 < lastUsedSeg->size)
            {
                // Successful fastpath
                array->DirectSetItemInLastUsedSegmentAt(index2, value);
                return;
            }
        }

        ScriptContext* scriptContext = array->GetScriptContext();
        JavascriptOperators::SetItem(array, array, index, value, scriptContext);
    }